

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLTextureBuffer::resize
          (GLTextureBuffer *this,uint newX,uint newY)

{
  uint uVar1;
  PFNGLTEXIMAGE2DPROC p_Var2;
  GLenum GVar3;
  GLenum GVar4;
  GLenum GVar5;
  runtime_error *this_00;
  socklen_t in_ECX;
  uint in_EDX;
  sockaddr *__addr;
  uint in_ESI;
  GLTextureBuffer *in_RDI;
  undefined1 in_stack_00000057;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar6;
  
  TextureBuffer::resize(&in_RDI->super_TextureBuffer,in_ESI,in_EDX);
  bind(in_RDI,in_ESI,__addr,in_ECX);
  p_Var2 = glad_glTexImage2D;
  if ((in_RDI->super_TextureBuffer).dim == 1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"OpenGL error: called 2D resize on 1D texture");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((in_RDI->super_TextureBuffer).dim == 2) {
    GVar3 = internalFormat((TextureFormat *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    uVar6 = (in_RDI->super_TextureBuffer).sizeX;
    uVar1 = (in_RDI->super_TextureBuffer).sizeY;
    GVar4 = formatF((TextureFormat *)CONCAT44(uVar6,GVar3));
    GVar5 = backend_openGL3_glfw::type((TextureFormat *)CONCAT44(uVar6,GVar3));
    (*p_Var2)(0xde1,0,GVar3,uVar6,uVar1,0,GVar4,GVar5,(void *)0x0);
  }
  checkGLError((bool)in_stack_00000057);
  return;
}

Assistant:

void GLTextureBuffer::resize(unsigned int newX, unsigned int newY) {

  TextureBuffer::resize(newX, newY);

  bind();
  if (dim == 1) {
    throw std::runtime_error("OpenGL error: called 2D resize on 1D texture");
  }
  if (dim == 2) {
    glTexImage2D(GL_TEXTURE_2D, 0, internalFormat(format), sizeX, sizeY, 0, formatF(format), type(format), nullptr);
  }
  checkGLError();
}